

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

double __thiscall
ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform *this,ON_Xform *N_xform)

{
  double dVar1;
  int iVar2;
  long lVar3;
  ON_Xform *pOVar4;
  double *pdVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double pivot;
  double scale;
  double p;
  ON_3dVector translation;
  double mrofx [4] [4];
  double d;
  ON_Xform rotation;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  ON_3dVector local_1b8;
  ON_Xform local_198;
  ON_Xform local_118;
  ON_Xform local_98;
  
  bVar7 = 0;
  pdVar5 = (double *)N_xform;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *(double *)this;
    this = (ON_Xform *)((long)this + 8);
    pdVar5 = pdVar5 + 1;
  }
  N_xform->m_xform[3][2] = 0.0;
  N_xform->m_xform[3][0] = 0.0;
  N_xform->m_xform[3][1] = 0.0;
  N_xform->m_xform[3][3] = 1.0;
  N_xform->m_xform[2][3] = 0.0;
  N_xform->m_xform[1][3] = 0.0;
  N_xform->m_xform[0][3] = 0.0;
  local_1d0 = 0.0;
  dVar1 = Determinant(N_xform,&local_1d0);
  dVar10 = ABS(dVar1);
  uVar8 = 0;
  uVar9 = 0;
  if (((dVar10 <= 3.308722450213671e-24) || (1.0 <= dVar10 * 3.308722450213671e-24)) ||
     (ABS(local_1d0) <= dVar10 * 2.220446049250313e-16)) goto LAB_0068af0c;
  local_1e8 = SUB84(dVar1,0);
  uStack_1e4 = (undefined4)((ulong)dVar1 >> 0x20);
  local_1b8.z = ON_3dVector::NanVector.z;
  local_1b8.x = ON_3dVector::NanVector.x;
  local_1b8.y = ON_3dVector::NanVector.y;
  local_1c8 = ON_DBL_QNAN;
  pOVar4 = &Nan;
  pOVar6 = &local_98;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  iVar2 = DecomposeSimilarity(N_xform,&local_1b8,&local_1c8,&local_98,2.3283064365386963e-10);
  if (iVar2 == 0) {
    local_118.m_xform[0][0] = 0.0;
    local_1c0 = 0.0;
    iVar2 = Inv((double *)N_xform,(double (*) [4])&local_198,(double *)&local_118,&local_1c0);
    pOVar4 = &local_198;
    pOVar6 = N_xform;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    uVar8 = 0;
    uVar9 = 0;
    if (iVar2 != 4) goto LAB_0068af0c;
    N_xform->m_xform[3][0] = 0.0;
    N_xform->m_xform[3][1] = 0.0;
    N_xform->m_xform[3][2] = 0.0;
    N_xform->m_xform[3][3] = 1.0;
    N_xform->m_xform[2][3] = 0.0;
    N_xform->m_xform[1][3] = 0.0;
    N_xform->m_xform[0][3] = 0.0;
    Transpose(N_xform);
    uVar8 = local_1e8;
    uVar9 = uStack_1e4;
    if (ABS(ABS(dVar1) + -1.0) <= 1.490116119385e-08) goto LAB_0068af0c;
    dVar1 = pow(dVar1,-0.3333333333333333);
    uVar8 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    pOVar4 = &local_98;
    pOVar6 = N_xform;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    uVar8 = local_1e8;
    uVar9 = uStack_1e4;
    if (0.0 <= dVar1) goto LAB_0068af0c;
    uVar8 = 0;
    uVar9 = 0xbff00000;
  }
  ON_Xform(&local_118,(double)CONCAT44(uVar9,uVar8));
  operator*(&local_198,&local_118,N_xform);
  pOVar4 = &local_198;
  for (lVar3 = 0x10; uVar8 = local_1e8, uVar9 = uStack_1e4, lVar3 != 0; lVar3 = lVar3 + -1) {
    N_xform->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
    N_xform = (ON_Xform *)((long)N_xform + ((ulong)bVar7 * -2 + 1) * 8);
  }
LAB_0068af0c:
  return (double)CONCAT44(uVar9,uVar8);
}

Assistant:

double ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform& N_xform) const
{
  N_xform = *this;
  N_xform.Linearize();
  double pivot = 0;
  double det = N_xform.Determinant(&pivot);

  double tol = ON_SQRT_EPSILON * ON_SQRT_EPSILON * ON_SQRT_EPSILON;
  if (fabs(det) <= tol || fabs(det) * tol >= 1.0 || fabs(pivot) <= ON_EPSILON * fabs(det))
    return 0.;

  ON_3dVector translation{ ON_3dVector::NanVector };
  double scale{ ON_DBL_QNAN };
  ON_Xform rotation{ ON_Xform::Nan };
  const int is_similarity = N_xform.DecomposeSimilarity(translation, scale, rotation, ON_ZERO_TOLERANCE);
  // If it's a uniform scale, handle it, otherwise need to get the inverse.
  if (is_similarity != 0)
  {
    N_xform = rotation;
    if (det < 0)
    {
      N_xform = ON_Xform(-1.) * N_xform;
    }
    return det;
  }

  if (!N_xform.Invert()) return 0.;
  N_xform.Linearize();
  N_xform.Transpose();
  if (abs(abs(det) - 1) > ON_SQRT_EPSILON)
  {
    N_xform = ON_Xform(pow(det, -1. / 3.)) * N_xform;
  }

  return det;
}